

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_runner.hpp
# Opt level: O0

void __thiscall Catch::Session::showHelp(Session *this,string *processName)

{
  char *__lhs;
  bool bVar1;
  ostream *poVar2;
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *processName_local;
  Session *this_local;
  
  local_18 = processName;
  processName_local = (string *)this;
  poVar2 = cout();
  poVar2 = std::operator<<(poVar2,"\nCatch v");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,libraryVersion);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,DAT_002035ac);
  poVar2 = std::operator<<(poVar2," build ");
  std::ostream::operator<<(poVar2,DAT_002035b0);
  __lhs = DAT_002035b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"master",&local_39);
  bVar1 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (bVar1) {
    poVar2 = cout();
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = std::operator<<(poVar2,DAT_002035b8);
    std::operator<<(poVar2," branch)");
  }
  poVar2 = cout();
  std::operator<<(poVar2,"\n");
  poVar2 = cout();
  Clara::CommandLine<Catch::ConfigData>::usage(&this->m_cli,poVar2,local_18);
  poVar2 = cout();
  poVar2 = std::operator<<(poVar2,"For more detail usage please see the project docs\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void showHelp( std::string const& processName ) {
            Catch::cout() << "\nCatch v"    << libraryVersion.majorVersion << "."
                                        << libraryVersion.minorVersion << " build "
                                        << libraryVersion.buildNumber;
            if( libraryVersion.branchName != std::string( "master" ) )
                Catch::cout() << " (" << libraryVersion.branchName << " branch)";
            Catch::cout() << "\n";

            m_cli.usage( Catch::cout(), processName );
            Catch::cout() << "For more detail usage please see the project docs\n" << std::endl;
        }